

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sssort.c
# Opt level: O2

saint_t ss_compare(sauchar_t *T,saidx_t *p1,saidx_t *p2,saidx_t depth)

{
  byte *pbVar1;
  byte *pbVar2;
  byte *pbVar3;
  
  pbVar1 = T + (long)*p1 + (long)depth;
  pbVar3 = T + (long)p2[1] + 2;
  for (pbVar2 = T + (long)*p2 + (long)depth; (pbVar1 < T + (long)p1[1] + 2 && (pbVar2 < pbVar3));
      pbVar2 = pbVar2 + 1) {
    if (*pbVar1 != *pbVar2) goto LAB_001034c8;
    pbVar1 = pbVar1 + 1;
  }
  if (T + (long)p1[1] + 2 <= pbVar1) {
    return -(uint)(pbVar2 < pbVar3);
  }
  if (pbVar3 <= pbVar2) {
    return 1;
  }
LAB_001034c8:
  return (uint)*pbVar1 - (uint)*pbVar2;
}

Assistant:

static INLINE
saint_t
ss_compare(const sauchar_t *T,
           const saidx_t *p1, const saidx_t *p2,
           saidx_t depth) {
  const sauchar_t *U1, *U2, *U1n, *U2n;

  for(U1 = T + depth + *p1,
      U2 = T + depth + *p2,
      U1n = T + *(p1 + 1) + 2,
      U2n = T + *(p2 + 1) + 2;
      (U1 < U1n) && (U2 < U2n) && (*U1 == *U2);
      ++U1, ++U2) {
  }

  return U1 < U1n ?
        (U2 < U2n ? *U1 - *U2 : 1) :
        (U2 < U2n ? -1 : 0);
}